

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall
fasttext::DenseMatrix::multiplyRow(DenseMatrix *this,Vector *nums,int64_t ib,int64_t ie)

{
  float fVar1;
  int64_t iVar2;
  real *prVar3;
  DenseMatrix *in_RCX;
  long in_RDX;
  long in_RDI;
  int j;
  real n;
  int64_t i;
  undefined4 in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  DenseMatrix *this_00;
  int local_30;
  long local_28;
  DenseMatrix *local_20;
  
  local_20 = in_RCX;
  if (in_RCX == (DenseMatrix *)0xffffffffffffffff) {
    local_20 = *(DenseMatrix **)(in_RDI + 8);
  }
  this_00 = local_20;
  iVar2 = Vector::size((Vector *)0x1c4c5c);
  local_28 = in_RDX;
  if (iVar2 < (long)this_00) {
    __assert_fail("ie <= nums.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x44,"void fasttext::DenseMatrix::multiplyRow(const Vector &, int64_t, int64_t)")
    ;
  }
  for (; local_28 < (long)local_20; local_28 = local_28 + 1) {
    prVar3 = Vector::operator[]((Vector *)this_00,
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    fVar1 = *prVar3;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      for (local_30 = 0; (long)local_30 < *(long *)(in_RDI + 0x10); local_30 = local_30 + 1) {
        in_stack_ffffffffffffffbc = fVar1;
        prVar3 = at(this_00,CONCAT44(fVar1,in_stack_ffffffffffffffb8),0x1c4d0e);
        *prVar3 = in_stack_ffffffffffffffbc * *prVar3;
      }
    }
  }
  return;
}

Assistant:

void DenseMatrix::multiplyRow(const Vector& nums, int64_t ib, int64_t ie) {
  if (ie == -1) {
    ie = m_;
  }
  assert(ie <= nums.size());
  for (auto i = ib; i < ie; i++) {
    real n = nums[i - ib];
    if (n != 0) {
      for (auto j = 0; j < n_; j++) {
        at(i, j) *= n;
      }
    }
  }
}